

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

OPJ_BOOL opj_j2k_are_all_used_components_decoded(opj_j2k_t *p_j2k,opj_event_mgr_t *p_manager)

{
  bool bVar1;
  uint uVar2;
  opj_image_t *poVar3;
  long lVar4;
  ulong uVar5;
  
  uVar2 = (p_j2k->m_specific_param).m_decoder.m_numcomps_to_decode;
  if (uVar2 == 0) {
    poVar3 = p_j2k->m_output_image;
    if (poVar3->numcomps == 0) {
      return 1;
    }
    bVar1 = true;
    lVar4 = 0x30;
    uVar5 = 0;
    do {
      if (*(long *)((long)&poVar3->comps->dx + lVar4) == 0) {
        bVar1 = false;
        opj_event_msg(p_manager,2,"Failed to decode component %d\n",uVar5 & 0xffffffff);
        poVar3 = p_j2k->m_output_image;
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x40;
    } while (uVar5 < poVar3->numcomps);
  }
  else {
    bVar1 = true;
    uVar5 = 0;
    do {
      if (p_j2k->m_output_image->comps
          [(p_j2k->m_specific_param).m_decoder.m_comps_indices_to_decode[uVar5]].data ==
          (OPJ_INT32 *)0x0) {
        bVar1 = false;
        opj_event_msg(p_manager,2,"Failed to decode component %d\n");
        uVar2 = (p_j2k->m_specific_param).m_decoder.m_numcomps_to_decode;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar2);
  }
  if (!bVar1) {
    opj_event_msg(p_manager,1,"Failed to decode all used components\n");
  }
  return (uint)bVar1;
}

Assistant:

static OPJ_BOOL opj_j2k_are_all_used_components_decoded(opj_j2k_t *p_j2k,
        opj_event_mgr_t * p_manager)
{
    OPJ_UINT32 compno;
    OPJ_BOOL decoded_all_used_components = OPJ_TRUE;

    if (p_j2k->m_specific_param.m_decoder.m_numcomps_to_decode) {
        for (compno = 0;
                compno < p_j2k->m_specific_param.m_decoder.m_numcomps_to_decode; compno++) {
            OPJ_UINT32 dec_compno =
                p_j2k->m_specific_param.m_decoder.m_comps_indices_to_decode[compno];
            if (p_j2k->m_output_image->comps[dec_compno].data == NULL) {
                opj_event_msg(p_manager, EVT_WARNING, "Failed to decode component %d\n",
                              dec_compno);
                decoded_all_used_components = OPJ_FALSE;
            }
        }
    } else {
        for (compno = 0; compno < p_j2k->m_output_image->numcomps; compno++) {
            if (p_j2k->m_output_image->comps[compno].data == NULL) {
                opj_event_msg(p_manager, EVT_WARNING, "Failed to decode component %d\n",
                              compno);
                decoded_all_used_components = OPJ_FALSE;
            }
        }
    }

    if (decoded_all_used_components == OPJ_FALSE) {
        opj_event_msg(p_manager, EVT_ERROR, "Failed to decode all used components\n");
        return OPJ_FALSE;
    }

    return OPJ_TRUE;
}